

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O1

size_t ra_portable_size_in_bytes(roaring_array_t *ra)

{
  uint32_t uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  int *piVar5;
  uint8_t uVar6;
  
  uVar1 = ra_portable_header_size(ra);
  uVar2 = (ulong)uVar1;
  if (0 < (long)ra->size) {
    lVar3 = 0;
    do {
      piVar5 = (int *)ra->containers[lVar3];
      uVar6 = ra->typecodes[lVar3];
      if (uVar6 == '\x04') {
        uVar6 = (uint8_t)piVar5[2];
        piVar5 = *(int **)piVar5;
      }
      if (uVar6 == '\x01') {
        iVar4 = 0x2000;
      }
      else if (uVar6 == '\x03') {
        iVar4 = *piVar5 * 4 + 2;
      }
      else {
        iVar4 = *piVar5 * 2;
      }
      uVar2 = uVar2 + (long)iVar4;
      lVar3 = lVar3 + 1;
    } while (ra->size != lVar3);
  }
  return uVar2;
}

Assistant:

size_t ra_portable_size_in_bytes(const roaring_array_t *ra) {
    size_t count = ra_portable_header_size(ra);

    for (int32_t k = 0; k < ra->size; ++k) {
        count += container_size_in_bytes(ra->containers[k], ra->typecodes[k]);
    }
    return count;
}